

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot)

{
  iterator it;
  bool bVar1;
  PointerType pSVar2;
  iterator iVar3;
  PositionType pos;
  iterator local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar1 = Snapshot::IsValid(&originSnapshot);
  if (bVar1) {
    it.Position = originSnapshot.Position.Position;
    it.Tree = originSnapshot.Position.Tree;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = (iterator)ZEXT816(0);
    local_38 = 0;
    local_58 = cmLinkedTree<cmState::SnapshotDataType>::Extend_impl
                         (&this->SnapshotData,it,(SnapshotDataType)ZEXT1640(ZEXT816(0)));
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_58);
    (pSVar2->DirectoryParent).Tree = originSnapshot.Position.Tree;
    (pSVar2->DirectoryParent).Position = originSnapshot.Position.Position;
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_58);
    pSVar2->SnapshotType = BuildsystemDirectoryType;
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position)
    ;
    iVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend
                      (&this->BuildsystemDirectory,pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_58);
    pSVar2->BuildSystemDirectory = iVar3;
    __return_storage_ptr__->State = this;
    (__return_storage_ptr__->Position).Tree = local_58.Tree;
    (__return_storage_ptr__->Position).Position = local_58.Position;
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmState.cxx"
                ,0x2b3,"cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot)");
}

Assistant:

cmState::Snapshot
cmState::CreateBuildsystemDirectorySnapshot(Snapshot originSnapshot)
{
  assert(originSnapshot.IsValid());
  PositionType pos = this->SnapshotData.Extend(originSnapshot.Position);
  pos->DirectoryParent = originSnapshot.Position;
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Extend(
        originSnapshot.Position->BuildSystemDirectory);
  return cmState::Snapshot(this, pos);
}